

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int foreach_hash_entry(hash_table_t *table,void *opaque,
                      _func_int_hash_key_t_hash_data_t_void_ptr *cb)

{
  int iVar1;
  code *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  hash_entry_t *i;
  int result;
  undefined8 *local_30;
  
  local_30 = *(undefined8 **)(in_RDI + 0x28);
  while( true ) {
    if (local_30 == (undefined8 *)0x0) {
      return 0;
    }
    iVar1 = (*in_RDX)(*local_30,local_30[1],in_RSI);
    if (iVar1 != 0) break;
    local_30 = (undefined8 *)local_30[3];
  }
  return iVar1;
}

Assistant:

int foreach_hash_entry(hash_table_t *table, void *opaque, int (*cb)(hash_key_t key, hash_data_t data, void *opaque))
{
   int result;
   struct hash_entry_t *i;
   for (i = table->head; i != NULL; i = i->next) {
      result = cb(i->key, i->data, opaque);
      if (result != 0)
         return result;
   }
   return 0;
}